

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_conf_alpn_protocols(mbedtls_ssl_config *conf,char **protos)

{
  size_t sVar1;
  char **ppcVar2;
  ulong uVar3;
  
  uVar3 = 0;
  ppcVar2 = protos;
  while( true ) {
    if (*ppcVar2 == (char *)0x0) {
      conf->alpn_list = protos;
      return 0;
    }
    sVar1 = strlen(*ppcVar2);
    if (sVar1 - 0x100 < 0xffffffffffffff01) break;
    uVar3 = uVar3 + sVar1;
    ppcVar2 = ppcVar2 + 1;
    if (0xffff < uVar3) {
      return -0x7100;
    }
  }
  return -0x7100;
}

Assistant:

int mbedtls_ssl_conf_alpn_protocols( mbedtls_ssl_config *conf, const char **protos )
{
    size_t cur_len, tot_len;
    const char **p;

    /*
     * "Empty strings MUST NOT be included and byte strings MUST NOT be
     * truncated". Check lengths now rather than later.
     */
    tot_len = 0;
    for( p = protos; *p != NULL; p++ )
    {
        cur_len = strlen( *p );
        tot_len += cur_len;

        if( cur_len == 0 || cur_len > 255 || tot_len > 65535 )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    conf->alpn_list = protos;

    return( 0 );
}